

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O1

int Maj3_ManAddCnfStart(Maj3_Man_t *p)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int (*paiVar8) [32];
  long lVar9;
  int pLits [32];
  int local_a8 [34];
  
  lVar9 = (long)p->nVars;
  uVar2 = (ulong)(uint)p->nObjs;
  if (p->nVars < p->nObjs) {
    paiVar8 = p->VarMarks + lVar9;
    do {
      if ((int)uVar2 < 1) {
        uVar3 = 0;
      }
      else {
        uVar5 = 0;
        uVar3 = 0;
        do {
          uVar3 = uVar3 + ((*paiVar8)[uVar5] == 1);
          uVar5 = uVar5 + 1;
        } while ((uVar2 & 0xffffffff) != uVar5);
      }
      if (3 < uVar3) {
        __assert_fail("Count <= 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                      ,0x11c,"int Maj3_ManAddCnfStart(Maj3_Man_t *)");
      }
      if (uVar3 != 3) {
        if ((int)uVar2 < 1) {
          iVar4 = 0;
        }
        else {
          uVar5 = 0;
          iVar4 = 0;
          do {
            if (1 < (*paiVar8)[uVar5]) {
              lVar6 = (long)iVar4;
              iVar4 = iVar4 + 1;
              local_a8[lVar6] = (*paiVar8)[uVar5] * 2;
            }
            uVar5 = uVar5 + 1;
          } while ((uVar2 & 0xffffffff) != uVar5);
        }
        if (iVar4 < 1) {
          __assert_fail("nLits > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                        ,0x125,"int Maj3_ManAddCnfStart(Maj3_Man_t *)");
        }
        iVar4 = bmcg_sat_solver_addclause(p->pSat,local_a8,iVar4);
        if (iVar4 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                        ,0x127,"int Maj3_ManAddCnfStart(Maj3_Man_t *)");
        }
      }
      lVar9 = lVar9 + 1;
      uVar2 = (ulong)p->nObjs;
      paiVar8 = paiVar8 + 1;
    } while (lVar9 < (long)uVar2);
  }
  uVar2 = (ulong)(uint)p->nObjs;
  if (1 < p->nObjs) {
    paiVar8 = p->VarMarks;
    lVar9 = 0;
    do {
      uVar3 = 0;
      if (0 < (int)uVar2) {
        lVar6 = 0;
        uVar3 = 0;
        do {
          uVar3 = uVar3 + (*(int *)((long)*paiVar8 + lVar6) == 1);
          lVar6 = lVar6 + 0x80;
        } while ((uVar2 & 0xffffffff) << 7 != lVar6);
      }
      if (3 < uVar3) {
        __assert_fail("Count <= 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                      ,0x131,"int Maj3_ManAddCnfStart(Maj3_Man_t *)");
      }
      if (uVar3 == 0) {
        if ((int)uVar2 < 1) {
          iVar4 = 0;
        }
        else {
          lVar6 = 0;
          iVar4 = 0;
          do {
            iVar1 = *(int *)((long)*paiVar8 + lVar6);
            if (1 < iVar1) {
              lVar7 = (long)iVar4;
              iVar4 = iVar4 + 1;
              local_a8[lVar7] = iVar1 * 2;
            }
            lVar6 = lVar6 + 0x80;
          } while ((uVar2 & 0xffffffff) << 7 != lVar6);
        }
        if ((0 < iVar4) && (iVar4 = bmcg_sat_solver_addclause(p->pSat,local_a8,iVar4), iVar4 == 0))
        {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                        ,0x13c,"int Maj3_ManAddCnfStart(Maj3_Man_t *)");
        }
      }
      lVar9 = lVar9 + 1;
      uVar2 = (ulong)p->nObjs;
      paiVar8 = (int (*) [32])(*paiVar8 + 1);
    } while (lVar9 < (long)(uVar2 - 1));
  }
  iVar4 = bmcg_sat_solver_solve(p->pSat,(int *)0x0,0);
  if (iVar4 != 1) {
    __assert_fail("status == GLUCOSE_SAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                  ,0x13f,"int Maj3_ManAddCnfStart(Maj3_Man_t *)");
  }
  Maj3_ManVarMapPrint(p);
  return 1;
}

Assistant:

int Maj3_ManAddCnfStart( Maj3_Man_t * p )
{
    int i, k, status, nLits, pLits[MAJ3_OBJS];
    // nodes have at least one fanin
    //printf( "Fanin clauses:\n" );
    for ( i = p->nVars; i < p->nObjs; i++ )
    {
        // check if it is already connected
        int Count = 0;
        for ( k = 0; k < p->nObjs; k++ ) 
            Count += p->VarMarks[i][k] == 1;
        assert( Count <= 3 );
        if ( Count == 3 )
            continue;
        // collect connections
        nLits = 0;
        for ( k = 0; k < p->nObjs; k++ ) 
            if ( p->VarMarks[i][k] > 1 )
                pLits[nLits++] = Abc_Var2Lit( p->VarMarks[i][k], 0 );
        //Maj3_PrintClause( pLits, nLits );
        assert( nLits > 0 );
        if ( nLits > 0 && !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
            assert(0);
    }
    // nodes have at least one fanout
    //printf( "Fanout clauses:\n" );
    for ( k = 0; k < p->nObjs-1; k++ )
    {
        // check if it is already connected
        int Count = 0;
        for ( i = 0; i < p->nObjs; i++ ) 
            Count += p->VarMarks[i][k] == 1;
        assert( Count <= 3 );
        if ( Count > 0 )
            continue;
        // collect connections
        nLits = 0;
        for ( i = 0; i < p->nObjs; i++ ) 
            if ( p->VarMarks[i][k] > 1 )
                pLits[nLits++] = Abc_Var2Lit( p->VarMarks[i][k], 0 );
        //Maj3_PrintClause( pLits, nLits );
        //assert( nLits > 0 );
        if ( nLits > 0 && !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
            assert(0);
    }
    status = bmcg_sat_solver_solve( p->pSat, NULL, 0 );
    assert( status == GLUCOSE_SAT );
    Maj3_ManVarMapPrint( p );
    return 1;
}